

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

uint16_t __thiscall ast::Section::read16(Section *this,uint offset)

{
  ushort local_18;
  ushort local_16;
  uint16_t byte1;
  uint16_t byte0;
  uint offset_local;
  Section *this_local;
  
  local_16 = 0x55;
  local_18 = 0x55;
  if (offset < this->content_size) {
    local_16 = (ushort)this->content[offset];
  }
  if (offset + 1 < this->content_size) {
    local_18 = (ushort)this->content[(ulong)offset + 1];
  }
  return local_18 * 0x100 + local_16;
}

Assistant:

uint16_t Section::read16(unsigned offset)
{
	uint16_t byte0 = 0x55, byte1 = 0x55;
	if (offset < content_size)
		byte0 = *(content + offset);
	if (offset + 1 < content_size)
		byte1 = *(content + offset + 1);
	return (byte1 << 8) + byte0;
}